

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::ExtensionSet::AddString_abi_cxx11_
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  string *psVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated == false) goto LAB_003fcc95;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) != 9) {
        AddString_abi_cxx11_();
      }
      this_01 = pEVar1->field_0;
      goto LAB_003fcc7b;
    }
LAB_003fcca9:
    AddString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_003fccb3:
    this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x18);
    *(undefined8 *)this_01 = 0;
    *(undefined8 *)(this_01.int64_t_value + 8) = 0;
    *(Arena **)(this_01.int64_t_value + 0x10) = (Arena *)0x0;
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      AddString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_003fcc95:
      AddString_abi_cxx11_((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_003fcc9f:
      AddString_abi_cxx11_();
      goto LAB_003fcca9;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 9) goto LAB_003fcc9f;
    pEVar1->is_repeated = true;
    pEVar1->field_0xa = pEVar1->field_0xa | 1;
    pEVar1->is_packed = false;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_003fccb3;
    this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)Arena::Allocate(this_00,0x18);
    *(undefined8 *)this_01 = 0;
    *(undefined8 *)(this_01.int64_t_value + 8) = 0;
    *(Arena **)(this_01.int64_t_value + 0x10) = this_00;
  }
  (pEVar1->field_0).int64_t_value = (int64_t)this_01;
LAB_003fcc7b:
  psVar2 = (string *)RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)this_01);
  return psVar2;
}

Assistant:

std::string* ExtensionSet::AddString(int number, FieldType type,
                                     const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_STRING);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = false;
    extension->ptr.repeated_string_value =
        Arena::Create<RepeatedPtrField<std::string>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  }
  return extension->ptr.repeated_string_value->Add();
}